

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptWeakMap.cpp
# Opt level: O0

void __thiscall Js::JavascriptWeakMap::Set(JavascriptWeakMap *this,RecyclableObject *key,Var value)

{
  WeakMapKeyMap *this_00;
  TBValue local_31;
  WeakMapId local_30;
  WeakMapKeyMap *local_28;
  WeakMapKeyMap *keyMap;
  Var value_local;
  RecyclableObject *key_local;
  JavascriptWeakMap *this_local;
  
  keyMap = (WeakMapKeyMap *)value;
  value_local = key;
  key_local = (RecyclableObject *)this;
  local_28 = GetWeakMapKeyMapFromKey(this,key);
  if (local_28 == (WeakMapKeyMap *)0x0) {
    local_28 = AddWeakMapKeyMapToKey(this,(RecyclableObject *)value_local);
  }
  this_00 = local_28;
  local_30 = GetWeakMapId(this);
  JsUtil::
  BaseDictionary<void_*,_void_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::Item(this_00,&local_30,&keyMap);
  local_31 = true;
  JsUtil::
  SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
  ::Item(&(this->keySet).
          super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
         ,(TBKey *)&value_local,&local_31);
  return;
}

Assistant:

void JavascriptWeakMap::Set(RecyclableObject* key, Var value)
    {
        WeakMapKeyMap* keyMap = GetWeakMapKeyMapFromKey(key);

        if (keyMap == nullptr)
        {
            keyMap = AddWeakMapKeyMapToKey(key);
        }

        keyMap->Item(GetWeakMapId(), value);
        keySet.Item(key, true);
    }